

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O1

void __thiscall
wasm::IRBuilder::ChildPopper::ConstraintCollector::noteAnyI8ArrayReferenceType
          (ConstraintCollector *this,Expression **childp)

{
  pointer *ppCVar1;
  vector<wasm::IRBuilder::ChildPopper::Child,_std::allocator<wasm::IRBuilder::ChildPopper::Child>_>
  *this_00;
  iterator __position;
  Child local_20;
  
  this_00 = this->children;
  local_20.constraint.
  super_variant<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
  .
  super__Variant_base<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
  .
  super__Move_assign_alias<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
  .
  super__Copy_assign_alias<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
  .
  super__Move_ctor_alias<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
  .
  super__Copy_ctor_alias<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
  .
  super__Variant_storage_alias<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
  ._M_index = '\x04';
  __position._M_current =
       (this_00->
       super__Vector_base<wasm::IRBuilder::ChildPopper::Child,_std::allocator<wasm::IRBuilder::ChildPopper::Child>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this_00->
      super__Vector_base<wasm::IRBuilder::ChildPopper::Child,_std::allocator<wasm::IRBuilder::ChildPopper::Child>_>
      )._M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_20.childp = childp;
    std::
    vector<wasm::IRBuilder::ChildPopper::Child,_std::allocator<wasm::IRBuilder::ChildPopper::Child>_>
    ::_M_realloc_insert<wasm::IRBuilder::ChildPopper::Child>(this_00,__position,&local_20);
  }
  else {
    *(ulong *)((long)&((__position._M_current)->constraint).
                      super_variant<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
                      .
                      super__Variant_base<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
                      .
                      super__Move_assign_alias<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
                      .
                      super__Copy_assign_alias<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
                      .
                      super__Move_ctor_alias<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
                      .
                      super__Copy_ctor_alias<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
              + 8) =
         CONCAT71(local_20.constraint.
                  super_variant<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
                  .
                  super__Variant_base<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
                  .
                  super__Move_assign_alias<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
                  .
                  super__Copy_assign_alias<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
                  .
                  super__Move_ctor_alias<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
                  .
                  super__Copy_ctor_alias<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
                  .
                  super__Variant_storage_alias<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
                  ._9_7_,4);
    (__position._M_current)->childp = childp;
    *(_Variadic_union<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
      *)&((__position._M_current)->constraint).
         super_variant<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
         .
         super__Variant_base<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
         .
         super__Move_assign_alias<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
         .
         super__Copy_assign_alias<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
         .
         super__Move_ctor_alias<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
         .
         super__Copy_ctor_alias<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
         = local_20.constraint.
           super_variant<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
           .
           super__Variant_base<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
           .
           super__Move_assign_alias<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
           .
           super__Copy_assign_alias<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
           .
           super__Move_ctor_alias<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
           .
           super__Copy_ctor_alias<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
           .
           super__Variant_storage_alias<wasm::IRBuilder::ChildPopper::Subtype,_wasm::IRBuilder::ChildPopper::AnyType,_wasm::IRBuilder::ChildPopper::AnyReference,_wasm::IRBuilder::ChildPopper::AnyTuple,_wasm::IRBuilder::ChildPopper::AnyI8ArrayReference,_wasm::IRBuilder::ChildPopper::AnyI16ArrayReference>
           ._M_u;
    ppCVar1 = &(this_00->
               super__Vector_base<wasm::IRBuilder::ChildPopper::Child,_std::allocator<wasm::IRBuilder::ChildPopper::Child>_>
               )._M_impl.super__Vector_impl_data._M_finish;
    *ppCVar1 = *ppCVar1 + 1;
  }
  return;
}

Assistant:

void noteAnyI8ArrayReferenceType(Expression** childp) {
      children.push_back({childp, {AnyI8ArrayReference{}}});
    }